

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

void __thiscall
fmt::internal::PrintfArgFormatter<wchar_t>::visit_custom
          (PrintfArgFormatter<wchar_t> *this,CustomValue c)

{
  code *in_RDX;
  UI_STRING *uis;
  UI *in_RSI;
  ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t> *in_RDI;
  wchar_t *format;
  wchar_t format_str [2];
  BasicFormatter<wchar_t,_fmt::ArgFormatter<wchar_t>_> formatter;
  ArgList *this_00;
  ArgList *args;
  BasicFormatter<wchar_t,_fmt::ArgFormatter<wchar_t>_> *in_stack_ffffffffffffff80;
  undefined8 *local_70;
  undefined8 local_68;
  ArgList local_60;
  ArgList local_50 [4];
  UI *local_10;
  code *local_8;
  
  this_00 = &local_60;
  local_10 = in_RSI;
  local_8 = in_RDX;
  ArgList::ArgList(this_00);
  ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t>::writer(in_RDI,in_RSI,uis);
  args = local_50;
  BasicFormatter<wchar_t,_fmt::ArgFormatter<wchar_t>_>::BasicFormatter
            (in_stack_ffffffffffffff80,args,(BasicWriter<wchar_t> *)this_00);
  local_68 = 0x7d;
  local_70 = &local_68;
  (*local_8)(args,local_10,&local_70);
  BasicFormatter<wchar_t,_fmt::ArgFormatter<wchar_t>_>::~BasicFormatter
            ((BasicFormatter<wchar_t,_fmt::ArgFormatter<wchar_t>_> *)0x16fff5);
  return;
}

Assistant:

void visit_custom(Arg::CustomValue c) {
    BasicFormatter<Char> formatter(ArgList(), this->writer());
    const Char format_str[] = {'}', 0};
    const Char *format = format_str;
    c.format(&formatter, c.value, &format);
  }